

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigJust.c
# Opt level: O3

void Aig_ManJustExperiment(Aig_Man_t *pAig)

{
  Aig_Obj_t *pNode;
  int iVar1;
  int iVar2;
  Vec_Int_t *vSuppLits;
  int *__ptr;
  Aig_ManPack_t *p;
  Vec_Int_t *__ptr_00;
  long lVar3;
  long lVar4;
  uint uVar5;
  double dVar6;
  timespec ts;
  uint local_68;
  uint local_64;
  ulong local_60;
  double local_50;
  timespec local_48;
  long local_38;
  
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  vSuppLits = (Vec_Int_t *)malloc(0x10);
  vSuppLits->nCap = 100;
  vSuppLits->nSize = 0;
  __ptr = (int *)malloc(400);
  vSuppLits->pArray = __ptr;
  p = Aig_ManPackStart(pAig);
  __ptr_00 = Aig_ManPackConstNodes(p);
  if (__ptr_00->nSize < 1) {
    local_50 = 0.0;
    local_60 = 0;
    local_68 = 0;
    uVar5 = 0;
    local_64 = 0;
  }
  else {
    lVar4 = 0;
    iVar1 = 0;
    local_64 = 0;
    uVar5 = 0;
    local_68 = 0;
    local_60 = 0;
    local_38 = lVar3;
    do {
      iVar2 = __ptr_00->pArray[lVar4];
      if (((long)iVar2 < 0) || (pAig->vObjs->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pNode = (Aig_Obj_t *)pAig->vObjs->pArray[iVar2];
      if ((pNode->field_0x18 & 8) == 0) {
        iVar2 = Aig_ObjFindSatAssign(pAig,pNode,1,vSuppLits);
        if (iVar2 == 0) {
          local_64 = local_64 + 1;
        }
        else {
          uVar5 = uVar5 + 1;
LAB_00632b7c:
          iVar1 = iVar1 + vSuppLits->nSize;
          Aig_ManPackAddPattern(p,vSuppLits);
        }
      }
      else {
        iVar2 = Aig_ObjFindSatAssign(pAig,pNode,0,vSuppLits);
        if (iVar2 != 0) {
          local_60 = (ulong)((int)local_60 + 1);
          goto LAB_00632b7c;
        }
        local_68 = local_68 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < __ptr_00->nSize);
    __ptr = vSuppLits->pArray;
    local_50 = (double)iVar1;
    lVar3 = local_38;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vSuppLits);
  dVar6 = (double)(int)(uVar5 + (int)local_60);
  printf("PO =%6d. C0 =%6d. C0f =%6d. C1 =%6d. C1f =%6d. (%6.2f %%) Ave =%4.1f ",
         (dVar6 * 100.0) / (double)pAig->nObjs[3],local_50 / dVar6,(ulong)(uint)pAig->nObjs[3],
         local_60,(ulong)local_68,(ulong)uVar5,(ulong)local_64);
  iVar2 = 3;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar2,"%s =","T");
  Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  Aig_ManCleanMarkAB(pAig);
  Aig_ManPackStop(p);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  return;
}

Assistant:

void Aig_ManJustExperiment( Aig_Man_t * pAig )
{
    Aig_ManPack_t * pPack;
    Vec_Int_t * vSuppLits, * vNodes;
    Aig_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    int Count0 = 0, Count0f = 0, Count1 = 0, Count1f = 0;
    int nTotalLits = 0;
    vSuppLits = Vec_IntAlloc( 100 );
    pPack = Aig_ManPackStart( pAig );
    vNodes = Aig_ManPackConstNodes( pPack );
//    Aig_ManForEachCo( pAig, pObj, i )
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
    {
        if ( pObj->fPhase ) // const 1
        {
            if ( Aig_ObjFindSatAssign(pAig, pObj, 0, vSuppLits) )
            {
//                assert( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) == AIG_VAL0 );
//                if ( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) != AIG_VAL0 )
//                    printf( "Justification error!\n" );
                Count0++;
                nTotalLits += Vec_IntSize(vSuppLits);
                Aig_ManPackAddPattern( pPack, vSuppLits );
            }
            else
                Count0f++;
        }
        else
        {
            if ( Aig_ObjFindSatAssign(pAig, pObj, 1, vSuppLits) )
            {
//                assert( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) == AIG_VAL1 );
//                if ( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) != AIG_VAL1 )
//                    printf( "Justification error!\n" );
                Count1++;
                nTotalLits += Vec_IntSize(vSuppLits);
                Aig_ManPackAddPattern( pPack, vSuppLits );
            }
            else
                Count1f++;
        }
    }
    Vec_IntFree( vSuppLits );
    printf( "PO =%6d. C0 =%6d. C0f =%6d. C1 =%6d. C1f =%6d. (%6.2f %%) Ave =%4.1f ", 
        Aig_ManCoNum(pAig), Count0, Count0f, Count1, Count1f, 100.0*(Count0+Count1)/Aig_ManCoNum(pAig), 1.0*nTotalLits/(Count0+Count1) );
    Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    Aig_ManCleanMarkAB( pAig );
    Aig_ManPackStop( pPack );
    Vec_IntFree( vNodes );
}